

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.h
# Opt level: O3

uint llvm::ComputeEditDistance<char>
               (ArrayRef<char> FromArray,ArrayRef<char> ToArray,bool AllowReplacements,
               uint MaxEditDistance)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  uint *puVar16;
  ulong uVar17;
  uint local_178 [2];
  uint SmallBuffer [64];
  uint *local_40;
  
  uVar12 = FromArray.Length;
  uVar6 = ToArray.Length;
  uVar10 = uVar6 + 1;
  if (uVar10 < 0x41) {
    puVar5 = local_178;
    if (uVar6 == 0) {
      local_40 = (uint *)0x0;
      bVar2 = true;
      goto LAB_00da22b0;
    }
    local_40 = (uint *)0x0;
  }
  else {
    puVar5 = (uint *)operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | uVar10 * 4);
    local_40 = puVar5;
  }
  uVar10 = 1;
  do {
    puVar5[uVar10] = (uint)uVar10;
    uVar10 = (ulong)((uint)uVar10 + 1);
  } while (uVar10 <= uVar6);
  bVar2 = false;
LAB_00da22b0:
  if (uVar12 != 0) {
    uVar3 = MaxEditDistance + 1;
    uVar10 = 1;
    do {
      uVar4 = (uint)uVar10;
      *puVar5 = uVar4;
      if (!bVar2) {
        uVar1 = uVar10 - 1;
        uVar7 = uVar10 & 0xffffffff;
        uVar13 = uVar1 & 0xffffffff;
        uVar14 = uVar10 & 0xffffffff;
        pcVar15 = ToArray.Data;
        uVar17 = uVar6;
        puVar11 = puVar5;
        do {
          puVar16 = puVar11 + 1;
          uVar8 = (uint)uVar13;
          uVar4 = *puVar16;
          uVar13 = (ulong)uVar4;
          if (AllowReplacements) {
            if (uVar12 <= uVar1) {
LAB_00da23cb:
              __assert_fail("Index < Length && \"Invalid index!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/ArrayRef.h"
                            ,0xf0,
                            "const T &llvm::ArrayRef<char>::operator[](size_t) const [T = char]");
            }
            uVar9 = uVar8 + (FromArray.Data[uVar1] != *pcVar15);
            if (uVar4 < (uint)uVar7) {
              puVar11 = puVar16;
            }
            uVar8 = *puVar11 + 1;
            if (uVar9 <= *puVar11 + 1) {
              uVar8 = uVar9;
            }
          }
          else {
            if (uVar12 <= uVar1) goto LAB_00da23cb;
            if (FromArray.Data[uVar1] != *pcVar15) {
              if (uVar4 < (uint)uVar7) {
                puVar11 = puVar16;
              }
              uVar8 = *puVar11 + 1;
            }
          }
          *puVar16 = uVar8;
          if (uVar8 < (uint)uVar14) {
            uVar14 = (ulong)uVar8;
          }
          uVar4 = (uint)uVar14;
          pcVar15 = pcVar15 + 1;
          uVar7 = (ulong)uVar8;
          uVar17 = uVar17 - 1;
          puVar11 = puVar16;
        } while (uVar17 != 0);
      }
      if ((MaxEditDistance != 0) && (MaxEditDistance < uVar4)) goto LAB_00da2397;
      uVar10 = uVar10 + 1;
    } while (uVar10 <= uVar12);
  }
  uVar3 = puVar5[uVar6];
LAB_00da2397:
  if (local_40 != (uint *)0x0) {
    operator_delete__(local_40);
  }
  return uVar3;
}

Assistant:

unsigned ComputeEditDistance(ArrayRef<T> FromArray, ArrayRef<T> ToArray,
                             bool AllowReplacements = true,
                             unsigned MaxEditDistance = 0) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in Row[x-1], the top entry is what's in Row[x] from the last
  // iteration, and the top-left entry is stored in Previous.
  typename ArrayRef<T>::size_type m = FromArray.size();
  typename ArrayRef<T>::size_type n = ToArray.size();

  const unsigned SmallBufferSize = 64;
  unsigned SmallBuffer[SmallBufferSize];
  std::unique_ptr<unsigned[]> Allocated;
  unsigned *Row = SmallBuffer;
  if (n + 1 > SmallBufferSize) {
    Row = new unsigned[n + 1];
    Allocated.reset(Row);
  }

  for (unsigned i = 1; i <= n; ++i)
    Row[i] = i;

  for (typename ArrayRef<T>::size_type y = 1; y <= m; ++y) {
    Row[0] = y;
    unsigned BestThisRow = Row[0];

    unsigned Previous = y - 1;
    for (typename ArrayRef<T>::size_type x = 1; x <= n; ++x) {
      int OldRow = Row[x];
      if (AllowReplacements) {
        Row[x] = std::min(
            Previous + (FromArray[y-1] == ToArray[x-1] ? 0u : 1u),
            std::min(Row[x-1], Row[x])+1);
      }
      else {
        if (FromArray[y-1] == ToArray[x-1]) Row[x] = Previous;
        else Row[x] = std::min(Row[x-1], Row[x]) + 1;
      }
      Previous = OldRow;
      BestThisRow = std::min(BestThisRow, Row[x]);
    }

    if (MaxEditDistance && BestThisRow > MaxEditDistance)
      return MaxEditDistance + 1;
  }

  unsigned Result = Row[n];
  return Result;
}